

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall soplex::DataArray<bool>::reMax(DataArray<bool> *this,int newMax,int newSize)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_stack_0000002c;
  bool **in_stack_00000030;
  int in_stack_0000003c;
  bool **in_stack_00000040;
  int local_c;
  
  if (-1 < in_EDX) {
    *in_RDI = in_EDX;
  }
  local_c = in_ESI;
  if (in_ESI < in_EDX) {
    local_c = in_EDX;
  }
  if (local_c < 1) {
    local_c = 1;
  }
  if (local_c != in_RDI[1]) {
    in_RDI[1] = local_c;
    if (*in_RDI < 1) {
      spx_free<bool*>((bool **)0x2dc688);
      spx_alloc<bool*>(in_stack_00000030,in_stack_0000002c);
    }
    else {
      spx_realloc<bool*>(in_stack_00000040,in_stack_0000003c);
    }
  }
  return;
}

Assistant:

void reMax(int newMax = 1, int newSize = -1)
   {
      if(newSize >= 0)
         thesize = newSize;

      if(newMax < newSize)
         newMax = newSize;

      if(newMax < 1)
         newMax = 1;

      if(newMax == themax)
         return;

      themax = newMax;

      if(thesize <= 0)
      {
         /* no data needs to be copied so do a clean free and alloc */
         spx_free(data);
         spx_alloc(data, themax);
      }
      else
         spx_realloc(data, themax);
   }